

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_section.cpp
# Opt level: O0

bool pstore::repo::operator==(section_content *lhs,section_content *rhs)

{
  bool bVar1;
  bool local_19;
  section_content *rhs_local;
  section_content *lhs_local;
  
  local_19 = false;
  if ((lhs->kind == rhs->kind) && (local_19 = false, lhs->align == rhs->align)) {
    bVar1 = pstore::operator==(&lhs->data,&rhs->data);
    local_19 = false;
    if (bVar1) {
      bVar1 = std::operator==(&lhs->ifixups,&rhs->ifixups);
      local_19 = false;
      if (bVar1) {
        local_19 = std::operator==(&lhs->xfixups,&rhs->xfixups);
      }
    }
  }
  return local_19;
}

Assistant:

bool operator== (section_content const & lhs, section_content const & rhs) {
            return lhs.kind == rhs.kind && lhs.align == rhs.align && lhs.data == rhs.data &&
                   lhs.ifixups == rhs.ifixups && lhs.xfixups == rhs.xfixups;
        }